

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Expression.cpp
# Opt level: O0

ExpressionValue * __thiscall
ExpressionValue::operator/
          (ExpressionValue *__return_storage_ptr__,ExpressionValue *this,ExpressionValue *other)

{
  ExpressionValueCombination EVar1;
  ExpressionValue *other_local;
  ExpressionValue *this_local;
  ExpressionValue *result;
  
  ExpressionValue(__return_storage_ptr__);
  EVar1 = getValueCombination(this->type,other->type);
  switch(EVar1) {
  case II:
    __return_storage_ptr__->type = Integer;
    if (((this->field_1).intValue == -0x8000000000000000) && ((other->field_1).intValue == -1)) {
      (__return_storage_ptr__->field_1).intValue = -0x8000000000000000;
      Logger::queueError<>(Warning,"Division overflow in expression");
    }
    else if ((other->field_1).intValue == 0) {
      (__return_storage_ptr__->field_1).intValue = -1;
      Logger::queueError<>(Warning,"Integer division by zero in expression");
    }
    else {
      (__return_storage_ptr__->field_1).intValue =
           (this->field_1).intValue / (other->field_1).intValue;
    }
    break;
  case IF:
    __return_storage_ptr__->type = Float;
    (__return_storage_ptr__->field_1).floatValue =
         (double)(this->field_1).intValue / (other->field_1).floatValue;
    break;
  default:
    break;
  case FI:
    __return_storage_ptr__->type = Float;
    (__return_storage_ptr__->field_1).floatValue =
         (this->field_1).floatValue / (double)(other->field_1).intValue;
    break;
  case FF:
    __return_storage_ptr__->type = Float;
    (__return_storage_ptr__->field_1).floatValue =
         (this->field_1).floatValue / (other->field_1).floatValue;
  }
  return __return_storage_ptr__;
}

Assistant:

ExpressionValue ExpressionValue::operator/(const ExpressionValue& other) const
{
	ExpressionValue result;
	switch (getValueCombination(type,other.type))
	{
	case ExpressionValueCombination::II:
		result.type = ExpressionValueType::Integer;
		if (intValue == INT64_MIN && other.intValue == -1){
			result.intValue = INT64_MIN;
			Logger::queueError(Logger::Warning, "Division overflow in expression");
			return result;
		}
		if (other.intValue == 0)
		{
			result.intValue = ~0;
			Logger::queueError(Logger::Warning, "Integer division by zero in expression");
			return result;
		}
		result.intValue = intValue / other.intValue;
		break;
	case ExpressionValueCombination::FI:
		result.type = ExpressionValueType::Float;
		result.floatValue = floatValue / other.intValue;
		break;
	case ExpressionValueCombination::IF:
		result.type = ExpressionValueType::Float;
		result.floatValue = intValue / other.floatValue;
		break;
	case ExpressionValueCombination::FF:
		result.type = ExpressionValueType::Float;
		result.floatValue = floatValue / other.floatValue;
		break;
	default:
		break;
	}

	return result;
}